

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int ncnn::get_big_cpu_count(void)

{
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  long lVar4;
  
  try_initialize_global_cpu_info();
  try_initialize_global_cpu_info();
  uVar2 = 0;
  iVar5 = 0;
  iVar6 = 0;
  auVar3 = _DAT_0059f020;
  do {
    uVar10 = g_cpu_affinity_mask_big.cpu_set.__bits[uVar2 >> 6];
    auVar8 = auVar3 & _DAT_0059f570;
    auVar9._8_4_ = auVar8._8_4_;
    auVar9._12_4_ = auVar8._12_4_;
    auVar9._0_8_ = auVar8._8_8_;
    auVar7._8_4_ = (int)uVar10;
    auVar7._0_8_ = uVar10;
    auVar7._12_4_ = (int)(uVar10 >> 0x20);
    uVar10 = 1L << auVar8._0_8_ & uVar10;
    uVar11 = 1L << auVar9._8_8_ & auVar7._8_8_;
    iVar5 = (iVar5 - (uint)((int)uVar10 == 0 && (int)(uVar10 >> 0x20) == 0)) + 1;
    iVar6 = (iVar6 - (uint)((int)uVar11 == 0 && (int)(uVar11 >> 0x20) == 0)) + 1;
    uVar2 = uVar2 + 2;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
  } while (uVar2 != 0x400);
  iVar1 = iVar6 + iVar5;
  if (iVar6 + iVar5 == 0) {
    iVar1 = g_cpucount;
  }
  return iVar1;
}

Assistant:

int get_big_cpu_count()
{
    try_initialize_global_cpu_info();
    int big_cpu_count = get_cpu_thread_affinity_mask(2).num_enabled();
    return big_cpu_count ? big_cpu_count : g_cpucount;
}